

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_d.c
# Opt level: O0

void test_d_after_zipfile(void)

{
  wchar_t wVar1;
  int r;
  char *reffile;
  
  extract_reference_file("test_basic.zip");
  wVar1 = systemf("%s %s -d foobar >test.out 2>test.err",testprog,"test_basic.zip");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_d.c"
                      ,L'#',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_non_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_d.c"
             ,L'$',"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_d.c"
             ,L'%',"test.err");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_d.c"
             ,L'\'',"contents a\n","foobar/test_basic/a");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_d.c"
             ,L'(',"contents b\n","foobar/test_basic/b");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_d.c"
             ,L')',"contents c\n","foobar/test_basic/c");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/unzip/test/test_d.c"
             ,L'*',"contents CAPS\n","foobar/test_basic/CAPS");
  return;
}

Assistant:

DEFINE_TEST(test_d_after_zipfile)
{
	const char *reffile = "test_basic.zip";
	int r;

	extract_reference_file(reffile);
	r = systemf("%s %s -d foobar >test.out 2>test.err", testprog, reffile);
	assertEqualInt(0, r);
	assertNonEmptyFile("test.out");
	assertEmptyFile("test.err");

	assertTextFileContents("contents a\n", "foobar/test_basic/a");
	assertTextFileContents("contents b\n", "foobar/test_basic/b");
	assertTextFileContents("contents c\n", "foobar/test_basic/c");
	assertTextFileContents("contents CAPS\n", "foobar/test_basic/CAPS");
}